

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaceOperations.cpp
# Opt level: O0

string * gmlc::networking::getLocalExternalAddressV4_abi_cxx11_(void)

{
  bool bVar1;
  __type_conflict1 _Var2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  size_type sVar4;
  string *in_RDI;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  string link_local_addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *addr;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interface_addresses;
  endpoint endpoint;
  iterator it;
  error_code ec;
  query query;
  resolver resolver;
  shared_ptr<gmlc::networking::AsioContextManager> srv;
  string resolved_address;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *addr_1;
  basic_resolver_entry<asio::ip::tcp> *in_stack_fffffffffffffd08;
  basic_resolver_query<asio::ip::tcp> *in_stack_fffffffffffffd10;
  address *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  string *in_stack_fffffffffffffd28;
  query *in_stack_fffffffffffffd30;
  protocol_type *in_stack_fffffffffffffd38;
  basic_resolver<asio::ip::tcp,_asio::any_io_executor> *this;
  basic_resolver_query<asio::ip::tcp> *this_00;
  string *__str_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_288;
  undefined1 *local_280;
  string *in_stack_fffffffffffffd98;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_248;
  undefined1 *local_240;
  int local_238;
  undefined1 local_231 [169];
  undefined1 local_188 [23];
  basic_resolver_query<asio::ip::tcp> local_171 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [2];
  
  __str_00 = in_RDI;
  std::__cxx11::string::string(in_stack_fffffffffffffd20);
  this_01 = local_58;
  std::__cxx11::string::string(in_stack_fffffffffffffd20);
  AsioContextManager::getContextPointer(in_stack_fffffffffffffd98);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd10);
  std::
  __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x715e79);
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          AsioContextManager::getBaseContext((AsioContextManager *)0x715e81);
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::basic_resolver<asio::io_context>
            ((basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)in_stack_fffffffffffffd30,
             (io_context *)in_stack_fffffffffffffd28,
             (constraint_t<is_convertible<io_context_&,_execution_context_&>::value>)
             ((ulong)in_stack_fffffffffffffd20 >> 0x20));
  local_171[0].host_name_.field_2._5_4_ = asio::ip::tcp::v4();
  asio::ip::host_name_abi_cxx11_();
  this_00 = (basic_resolver_query<asio::ip::tcp> *)(local_188 + 0x17);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
             (char *)__str,(allocator<char> *)this_00);
  asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            (this_00,in_stack_fffffffffffffd38,(string *)in_stack_fffffffffffffd30,
             in_stack_fffffffffffffd28,(flags)((ulong)in_stack_fffffffffffffd20 >> 0x20));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd10);
  std::allocator<char>::~allocator((allocator<char> *)(local_188 + 0x17));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd10);
  this = (basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)local_188;
  CLI::std::error_code::error_code((error_code *)in_stack_fffffffffffffd10);
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
            (this,in_stack_fffffffffffffd30,(error_code *)in_stack_fffffffffffffd28);
  asio::ip::basic_resolver_iterator<asio::ip::tcp>::basic_resolver_iterator
            ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffd10,
             (basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffd08);
  asio::ip::basic_resolver_results<asio::ip::tcp>::~basic_resolver_results
            ((basic_resolver_results<asio::ip::tcp> *)0x715f94);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_188);
  if (!bVar1) {
    in_stack_fffffffffffffd30 =
         (query *)asio::ip::basic_resolver_iterator<asio::ip::tcp>::operator*
                            ((basic_resolver_iterator<asio::ip::tcp> *)0x715fb6);
    asio::ip::basic_resolver_entry::operator_cast_to_basic_endpoint(in_stack_fffffffffffffd08);
    in_stack_fffffffffffffd28 = (string *)(local_231 + 0x1d);
    asio::ip::basic_endpoint<asio::ip::tcp>::address(&in_stack_fffffffffffffd08->endpoint_);
    asio::ip::address::to_string_abi_cxx11_(in_stack_fffffffffffffd18);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str_00
              );
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd10);
  }
  netif::getInterfaceAddressesV4_abi_cxx11_();
  bVar1 = CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffd20);
  if (bVar1) {
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x71615e);
    if (bVar1) {
      in_stack_fffffffffffffd20 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_231;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (char *)__str,(allocator<char> *)this_00);
      std::allocator<char>::~allocator((allocator<char> *)local_231);
      local_238 = 1;
    }
    else {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,__str);
      local_238 = 1;
    }
  }
  else {
    local_240 = local_231 + 1;
    local_248._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CLI::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffd08);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffd08);
    while (bVar1 = __gnu_cxx::
                   operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffd10,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffd08), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_248);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffd30,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffd28);
      if (_Var2) {
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,__str
                  );
        local_238 = 1;
        goto LAB_0071648d;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_248);
    }
    std::__cxx11::string::string(in_stack_fffffffffffffd20);
    local_280 = local_231 + 1;
    local_288._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CLI::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffd08);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffd08);
    while (bVar1 = __gnu_cxx::
                   operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffd10,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffd08), ((bVar1 ^ 0xffU) & 1) != 0) {
      bVar1 = false;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_288);
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,__str);
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28,
                         (size_type)in_stack_fffffffffffffd20);
      if (sVar4 == 0) {
LAB_007163e8:
        local_238 = 0;
      }
      else {
        in_stack_fffffffffffffd10 =
             (basic_resolver_query<asio::ip::tcp> *)
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28,
                        (size_type)in_stack_fffffffffffffd20);
        if (in_stack_fffffffffffffd10 == (basic_resolver_query<asio::ip::tcp> *)0x0) {
          bVar3 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x7163ca);
          if (bVar3) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffd10,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffd08);
          }
          goto LAB_007163e8;
        }
        bVar1 = true;
        local_238 = 1;
      }
      if (!bVar1) {
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd10);
      }
      if (local_238 != 0) goto LAB_0071646f;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_288);
    }
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x71642f);
    if (bVar1) {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,__str);
      local_238 = 1;
    }
    else {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,__str);
      local_238 = 1;
    }
LAB_0071646f:
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd10);
  }
LAB_0071648d:
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffd20);
  asio::ip::basic_resolver_iterator<asio::ip::tcp>::~basic_resolver_iterator
            ((basic_resolver_iterator<asio::ip::tcp> *)0x7164a7);
  asio::ip::basic_resolver_query<asio::ip::tcp>::~basic_resolver_query(in_stack_fffffffffffffd10);
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::~basic_resolver
            ((basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)in_stack_fffffffffffffd10);
  std::shared_ptr<gmlc::networking::AsioContextManager>::~shared_ptr
            ((shared_ptr<gmlc::networking::AsioContextManager> *)0x7164ce);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd10);
  return __str_00;
}

Assistant:

std::string getLocalExternalAddressV4()
{
    std::string resolved_address;
#ifndef GMLC_NETWORKING_DISABLE_ASIO
    auto srv = AsioContextManager::getContextPointer();

    asio::ip::tcp::resolver resolver(srv->getBaseContext());
    asio::ip::tcp::resolver::query query(
        asio::ip::tcp::v4(), asio::ip::host_name(), "");
    std::error_code ec;
    asio::ip::tcp::resolver::iterator it = resolver.resolve(query, ec);

    if (!ec) {
        asio::ip::tcp::endpoint endpoint = *it;
        resolved_address = endpoint.address().to_string();
    }
#endif
    auto interface_addresses = gmlc::netif::getInterfaceAddressesV4();

    // Return the resolved address if no interface addresses were found
    if (interface_addresses.empty()) {
        if (resolved_address.empty()) {
            return "0.0.0.0";
        }
        return resolved_address;
    }

    // Use the resolved address if it matches one of the interface addresses
    for (const auto& addr : interface_addresses) {
        if (addr == resolved_address) {
            return resolved_address;
        }
    }

    // Pick an interface that isn't an IPv4 loopback address, 127.0.0.1/8
    // or an IPv4 link-local address, 169.254.0.0/16
    std::string link_local_addr;
    for (auto addr : interface_addresses) {
        if (addr.rfind("127.", 0) != 0) {
            if (addr.rfind("169.254.", 0) != 0) {
                return addr;
            }
            if (link_local_addr.empty()) {
                link_local_addr = addr;
            }
        }
    }

    // Return a link-local address since no alternatives were found
    if (!link_local_addr.empty()) {
        return link_local_addr;
    }

    // Very likely that any address returned at this point won't be a working
    // external address
    return resolved_address;
}